

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblock.c
# Opt level: O2

_Bool no_nonblock(int fd)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *__format;
  FILE *__stream;
  
  uVar1 = fcntl(fd,3);
  __stream = _stderr;
  if ((int)uVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "%d: fcntl(F_GETFL): %s\n";
  }
  else {
    iVar2 = fcntl(fd,4,(ulong)(uVar1 & 0x7ffff7ff));
    __stream = _stderr;
    if (-1 < iVar2) {
      return (_Bool)((byte)(uVar1 >> 0xb) & 1);
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "%d: fcntl(F_SETFL): %s\n";
  }
  fprintf(__stream,__format,fd,pcVar4);
  exit(1);
}

Assistant:

bool no_nonblock(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFL);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFL): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFL, fdflags & ~O_NONBLOCK) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFL): %s\n", fd, strerror(errno));
        exit(1);
    }

    return fdflags & O_NONBLOCK;
}